

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream_suite.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  
  ostringstream_suite::test();
  wostringstream_suite::test();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    ostringstream_suite::test();
    wostringstream_suite::test();

    return boost::report_errors();
}